

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_image.cxx
# Opt level: O0

void __thiscall
Fl_PostScript_Graphics_Driver::draw
          (Fl_PostScript_Graphics_Driver *this,Fl_Pixmap *pxm,int XP,int YP,int WP,int HP,int cx,
          int cy)

{
  int iVar1;
  int local_38;
  int local_34;
  int h;
  int w;
  char **di;
  int HP_local;
  int WP_local;
  int YP_local;
  int XP_local;
  Fl_Pixmap *pxm_local;
  Fl_PostScript_Graphics_Driver *this_local;
  
  di._0_4_ = HP;
  di._4_4_ = WP;
  HP_local = YP;
  WP_local = XP;
  _YP_local = pxm;
  pxm_local = (Fl_Pixmap *)this;
  _h = Fl_Image::data(&pxm->super_Fl_Image);
  iVar1 = fl_measure_pixmap(_h,&local_34,&local_38);
  if (iVar1 != 0) {
    this->mask = (uchar *)0x0;
    fl_mask_bitmap = &this->mask;
    this->mx = di._4_4_;
    this->my = (uint)di;
    (*(this->super_Fl_Graphics_Driver).super_Fl_Device._vptr_Fl_Device[0x2a])
              (this,(ulong)(uint)WP_local,(ulong)(uint)HP_local,(ulong)di._4_4_,(ulong)(uint)di);
    fl_draw_pixmap(_h,WP_local - cx,HP_local - cy,0x38);
    (*(this->super_Fl_Graphics_Driver).super_Fl_Device._vptr_Fl_Device[0x2e])();
    if (this->mask != (uchar *)0x0) {
      operator_delete__(this->mask);
    }
    this->mask = (uchar *)0x0;
    fl_mask_bitmap = (uchar **)0x0;
  }
  return;
}

Assistant:

void Fl_PostScript_Graphics_Driver::draw(Fl_Pixmap * pxm,int XP, int YP, int WP, int HP, int cx, int cy){
  const char * const * di =pxm->data();
  int w,h;
  if (!fl_measure_pixmap(di, w, h)) return;
  mask=0;
  fl_mask_bitmap=&mask;
  mx = WP;
  my = HP;
  push_clip(XP, YP, WP, HP);
  fl_draw_pixmap(di,XP -cx, YP -cy, FL_BLACK );
  pop_clip();
  delete[] mask;
  mask=0;
  fl_mask_bitmap=0;
}